

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vars3.c
# Opt level: O1

cadr_cell cadr(LispPTR cell_adr)

{
  uint uVar1;
  uint uVar2;
  LispPTR LVar3;
  LispPTR LVar4;
  ulong uVar5;
  
  if ((*(ushort *)((ulong)(cell_adr >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
    if ((cell_adr & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)cell_adr);
    }
    uVar2 = *(uint *)(Lisp_world + cell_adr);
    while (uVar1 = uVar2, uVar1 < 0x10000000) {
      if ((uVar1 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
      }
      cell_adr = uVar1;
      uVar2 = *(uint *)(Lisp_world + uVar1);
    }
    LVar4 = uVar1 & 0xfffffff;
    if (uVar1 >> 0x1c != 8) {
      uVar5 = (ulong)(cell_adr + (uVar1 >> 0x1c & 7) * 2);
      if (uVar1 < 0x90000000) {
        if ((cell_adr & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar5);
        }
        uVar5 = (ulong)(*(uint *)(Lisp_world + uVar5) & 0xfffffff);
      }
      goto LAB_0013ab97;
    }
  }
  else {
    if (cell_adr != 0) {
      LVar4 = car(cell_adr);
      LVar3 = cdr(cell_adr);
      uVar5 = (ulong)LVar3;
      goto LAB_0013ab97;
    }
    LVar4 = 0;
  }
  uVar5 = 0;
LAB_0013ab97:
  return (cadr_cell)((ulong)LVar4 | uVar5 << 0x20);
}

Assistant:

struct cadr_cell cadr(LispPTR cell_adr)
/* address of cell */
/* Lisp address (word addressing) */
{
  ConsCell *pcons;
  struct cadr_cell cadr1; /* return value */
  short offset;

  if (Listp(cell_adr) == NIL) {
    if (cell_adr == NIL) {
      cadr1.car_cell = 0;
      cadr1.cdr_cell = 0;
      return (cadr1);
    } else {
      cadr1.car_cell = car(cell_adr);
      cadr1.cdr_cell = cdr(cell_adr);
      return (cadr1);
    }
  }
  pcons = (ConsCell *)NativeAligned4FromLAddr(cell_adr);
  while (pcons->cdr_code == CDR_INDIRECT) {
    /* CDR indirect */
    cell_adr = pcons->car_field;
    pcons = (ConsCell *)NativeAligned4FromLAddr(pcons->car_field);
  } /* skip CDR_INDIRECT cell */

  cadr1.car_cell = pcons->car_field;

  if (pcons->cdr_code == CDR_NIL) {
    /* CDR nil */
    cadr1.cdr_cell = NIL_PTR;
    return (cadr1);
  }
#ifdef NEWCDRCODING
  offset = (0x7 & pcons->cdr_code) << 1;
  if (pcons->cdr_code > CDR_NIL) {
    /* CDR on page */
    cadr1.cdr_cell = cell_adr + offset;
  } else {
    /* CDR different page */
    pcons = (ConsCell *)NativeAligned4FromLAddr((cell_adr) + offset);
    cadr1.cdr_cell = pcons->car_field;
  }
#else
  offset = (0x7F & pcons->cdr_code) << 1;
  if (pcons->cdr_code > CDR_NIL) {
    /* CDR on page */
    cadr1.cdr_cell = (mPAGEMASK & cell_adr) | offset;
  } else {
    /* CDR different page */
    pcons = (ConsCell *)NativeAligned4FromLAddr(((mPAGEMASK & cell_adr) | offset));
    cadr1.cdr_cell = pcons->car_field;
  }
#endif /* NEWCDRCODING */

  return (cadr1);
}